

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O2

void __thiscall
BRTS<TTA>::FindRuns(BRTS<TTA> *this,uint64_t *bits_start,int height,int data_width,Run *runs)

{
  uint64_t *puVar1;
  long lVar2;
  long lVar3;
  uint u;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  unsigned_short uVar8;
  uint64_t *puVar9;
  uint64_t *puVar10;
  Run *pRVar11;
  Run *pRVar12;
  unsigned_short uVar13;
  long lVar14;
  ulong *puVar15;
  ulong uVar16;
  uint64_t uVar17;
  short sVar18;
  Run *pRVar19;
  Run *pRVar20;
  
  lVar5 = (long)data_width;
  uVar16 = *bits_start;
  sVar18 = 0;
  pRVar11 = runs;
  puVar10 = bits_start;
  while( true ) {
    for (; puVar15 = puVar10 + 1, uVar16 != 0;
        uVar16 = (~uVar16 >> ((byte)lVar7 & 0x3f)) << ((byte)lVar7 & 0x3f)) {
      lVar7 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
        }
      }
      pRVar11->start_pos = (short)lVar7 + sVar18;
      uVar16 = (~uVar16 >> ((byte)lVar7 & 0x3f)) << ((byte)lVar7 & 0x3f);
      while (uVar16 == 0) {
        sVar18 = sVar18 + 0x40;
        puVar15 = puVar10 + 1;
        puVar10 = puVar10 + 1;
        uVar16 = ~*puVar15;
      }
      lVar7 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
        }
      }
      pRVar11->end_pos = (short)lVar7 + sVar18;
      uVar4 = TTA::NewLabel();
      pRVar11->label = uVar4;
      pRVar11 = pRVar11 + 1;
    }
    if (puVar15 == bits_start + lVar5) break;
    sVar18 = sVar18 + 0x40;
    uVar16 = *puVar15;
    puVar10 = puVar15;
  }
  pRVar11->start_pos = 0xffff;
  pRVar11->end_pos = 0xffff;
  lVar7 = 1;
LAB_001f240e:
  if (height <= lVar7) {
    uVar4 = TTA::Flatten();
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar4;
    return;
  }
  pRVar12 = pRVar11 + 1;
  puVar10 = bits_start + lVar7 * lVar5;
  puVar1 = puVar10 + lVar5;
  uVar17 = *puVar10;
  lVar6 = 0;
  pRVar11 = pRVar12;
  do {
    while (puVar9 = puVar10 + 1, uVar17 != 0) {
      lVar2 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      uVar16 = (~uVar17 >> ((byte)lVar2 & 0x3f)) << ((byte)lVar2 & 0x3f);
      lVar14 = lVar6;
      while (uVar16 == 0) {
        lVar14 = lVar14 + 0x40;
        puVar15 = puVar10 + 1;
        puVar10 = puVar10 + 1;
        uVar16 = ~*puVar15;
      }
      lVar3 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      pRVar20 = runs + -1;
      do {
        pRVar19 = pRVar20;
        runs = runs + 1;
        pRVar20 = pRVar19 + 1;
      } while ((uint)pRVar19[1].end_pos < ((int)lVar2 + (int)lVar6 & 0xffffU));
      uVar13 = (short)lVar2 + (short)lVar6;
      uVar8 = (unsigned_short)(lVar3 + lVar14);
      uVar4 = (uint)(lVar3 + lVar14) & 0xffff;
      if (uVar4 < pRVar20->start_pos) {
        pRVar11->start_pos = uVar13;
        pRVar11->end_pos = uVar8;
        u = TTA::NewLabel();
      }
      else {
        u = TTA::rtable_[pRVar19[1].label];
        if (pRVar19[1].end_pos < uVar4) {
          do {
            pRVar20 = runs;
            if (uVar4 < pRVar20->start_pos) break;
            if (u != TTA::rtable_[pRVar20->label]) {
              u = TTA::Merge(u,TTA::rtable_[pRVar20->label]);
            }
            runs = pRVar20 + 1;
          } while (pRVar20->end_pos < uVar4);
          pRVar11->start_pos = uVar13;
        }
        else {
          pRVar11->start_pos = uVar13;
        }
        pRVar11->end_pos = uVar8;
      }
      pRVar11->label = u;
      pRVar11 = pRVar11 + 1;
      lVar6 = lVar14;
      runs = pRVar20;
      uVar17 = -1L << ((byte)lVar3 & 0x3f) & ~uVar16;
    }
    if (puVar9 == puVar1) break;
    uVar17 = *puVar9;
    lVar6 = lVar6 + 0x40;
    puVar10 = puVar9;
  } while( true );
  pRVar11->start_pos = 0xffff;
  pRVar11->end_pos = 0xffff;
  lVar7 = lVar7 + 1;
  runs = pRVar12;
  goto LAB_001f240e;
}

Assistant:

void FindRuns(const uint64_t* bits_start, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);

            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::NewLabel();
        }
    out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;
            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this run starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::NewLabel();
                    continue;
                };

                unsigned label = LabelsSolver::GetLabel(runs_up->label);

                //Next upper run can not meet this
                if (end_pos <= runs_up->end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = label;
                    continue;
                }

                //Find next upper runs meet this
                runs_up++;
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                    if (label != label_other) label = LabelsSolver::Merge(label, label_other);
                    if (end_pos <= runs_up->end_pos) break;
                }
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
                runs->label = label;
            }

        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::Flatten();
    }